

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void bilinear_filter4xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  long lVar9;
  int val;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 auVar14 [16];
  short sVar20;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  short sVar37;
  undefined4 uVar46;
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  short sVar47;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar65;
  undefined1 auVar66 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 uVar18;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar51 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  
  if (xoffset == 0) {
    if (-1 < h) {
      lVar9 = 0;
      do {
        *(undefined4 *)(dst + lVar9 * 4) = *(undefined4 *)src;
        src = src + src_stride;
        lVar9 = lVar9 + 1;
      } while (h + 1 != (int)lVar9);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar9 = 0;
      do {
        uVar1 = *(undefined8 *)src;
        uVar15 = (undefined1)((ulong)uVar1 >> 8);
        uVar13 = pavgb(uVar15,(char)uVar1);
        uVar16 = (undefined1)((ulong)uVar1 >> 0x10);
        uVar15 = pavgb(uVar16,uVar15);
        uVar17 = (undefined1)((ulong)uVar1 >> 0x18);
        uVar16 = pavgb(uVar17,uVar16);
        uVar18 = (undefined1)((ulong)uVar1 >> 0x20);
        uVar17 = pavgb(uVar18,uVar17);
        uVar19 = (undefined1)((ulong)uVar1 >> 0x28);
        pavgb(uVar19,uVar18);
        uVar18 = (undefined1)((ulong)uVar1 >> 0x30);
        pavgb(uVar18,uVar19);
        uVar19 = (undefined1)((ulong)uVar1 >> 0x38);
        pavgb(uVar19,uVar18);
        pavgb(0,uVar19);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        *(uint *)(dst + lVar9 * 4) = CONCAT13(uVar17,CONCAT12(uVar16,CONCAT11(uVar15,uVar13)));
        src = src + src_stride;
        lVar9 = lVar9 + 1;
      } while (h + 1 != (int)lVar9);
    }
  }
  else {
    auVar11 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar11._4_4_ = auVar11._0_4_;
    auVar11._8_4_ = auVar11._0_4_;
    auVar11._12_4_ = auVar11._0_4_;
    puVar7 = dst;
    if (0 < h) {
      lVar9 = (long)src_stride;
      iVar10 = 0;
      do {
        uVar8 = *(ulong *)src;
        lVar3 = *(long *)((long)src + lVar9);
        uVar6 = *(ulong *)((long)src + lVar9 * 2);
        lVar2 = *(long *)((long)src + lVar9 * 3);
        auVar74._8_4_ = (int)(uVar8 >> 0x20);
        auVar74._0_8_ = uVar8;
        auVar74._12_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar76._0_8_ = lVar3 << 0x20;
        auVar83._4_8_ = auVar74._8_8_;
        auVar83._0_4_ = (int)lVar3;
        auVar83._12_4_ = 0;
        auVar83 = auVar83 << 0x20;
        auVar85._8_4_ = (int)(uVar6 >> 0x20);
        auVar85._0_8_ = uVar6;
        auVar85._12_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar87._0_8_ = lVar2 << 0x20;
        auVar84._4_8_ = auVar85._8_8_;
        auVar84._0_4_ = (int)lVar2;
        auVar84._12_4_ = 0;
        auVar84 = auVar84 << 0x20;
        auVar45._8_6_ = 0;
        auVar45._0_8_ = uVar8;
        auVar45[0xe] = (char)(uVar8 >> 0x38);
        auVar45[0xf] = (char)((ulong)lVar3 >> 0x38);
        auVar44._14_2_ = auVar45._14_2_;
        auVar44._8_5_ = 0;
        auVar44._0_8_ = uVar8;
        auVar44[0xd] = (char)((ulong)lVar3 >> 0x30);
        auVar43._13_3_ = auVar44._13_3_;
        auVar43._8_4_ = 0;
        auVar43._0_8_ = uVar8;
        auVar43[0xc] = (char)(uVar8 >> 0x30);
        auVar42._12_4_ = auVar43._12_4_;
        auVar42._8_3_ = 0;
        auVar42._0_8_ = uVar8;
        auVar42[0xb] = (char)((ulong)lVar3 >> 0x28);
        auVar41._11_5_ = auVar42._11_5_;
        auVar41._8_2_ = 0;
        auVar41._0_8_ = uVar8;
        auVar41[10] = (char)(uVar8 >> 0x28);
        auVar40._10_6_ = auVar41._10_6_;
        auVar40[8] = 0;
        auVar40._0_8_ = uVar8;
        auVar40[9] = (char)((ulong)lVar3 >> 0x20);
        auVar39._9_7_ = auVar40._9_7_;
        auVar39[8] = (char)(uVar8 >> 0x20);
        auVar39._0_8_ = uVar8;
        auVar38._8_8_ = auVar39._8_8_;
        uVar19 = (undefined1)((ulong)lVar3 >> 0x18);
        auVar38[7] = uVar19;
        uVar16 = (undefined1)(uVar8 >> 0x18);
        auVar38[6] = uVar16;
        uVar18 = (undefined1)((ulong)lVar3 >> 0x10);
        auVar38[5] = uVar18;
        uVar15 = (undefined1)(uVar8 >> 0x10);
        auVar38[4] = uVar15;
        uVar17 = (undefined1)((ulong)lVar3 >> 8);
        auVar38[3] = uVar17;
        uVar13 = (undefined1)(uVar8 >> 8);
        auVar38[2] = uVar13;
        auVar38[0] = (undefined1)uVar8;
        auVar38[1] = (char)lVar3;
        auVar45 = pshufb(auVar38,ZEXT816(0x907050308060402));
        auVar82._0_14_ = auVar83._0_14_;
        auVar82[0xe] = uVar19;
        auVar82[0xf] = auVar45[7];
        auVar81._14_2_ = auVar82._14_2_;
        auVar81._0_13_ = auVar83._0_13_;
        auVar81[0xd] = auVar45[6];
        auVar80._13_3_ = auVar81._13_3_;
        auVar80._0_12_ = auVar83._0_12_;
        auVar80[0xc] = uVar18;
        auVar79._12_4_ = auVar80._12_4_;
        auVar79._0_11_ = auVar83._0_11_;
        auVar79[0xb] = auVar45[5];
        auVar78._11_5_ = auVar79._11_5_;
        auVar78._0_10_ = auVar83._0_10_;
        auVar78[10] = uVar17;
        auVar77._10_6_ = auVar78._10_6_;
        auVar77._0_9_ = auVar83._0_9_;
        auVar77[9] = auVar45[4];
        auVar76._9_7_ = auVar77._9_7_;
        auVar76[8] = (char)lVar3;
        auVar75._8_8_ = auVar76._8_8_;
        auVar75[7] = auVar45[3];
        auVar75[6] = uVar16;
        auVar75[5] = auVar45[2];
        auVar75[4] = uVar15;
        auVar75[3] = auVar45[1];
        auVar75[2] = uVar13;
        auVar75[1] = auVar45[0];
        auVar75[0] = auVar38[0];
        auVar83 = pmaddubsw(auVar75,auVar11);
        sVar20 = pavgw(auVar83._0_2_ >> 6,0);
        sVar31 = pavgw(auVar83._2_2_ >> 6,0);
        sVar32 = pavgw(auVar83._4_2_ >> 6,0);
        sVar33 = pavgw(auVar83._6_2_ >> 6,0);
        sVar34 = pavgw(auVar83._8_2_ >> 6,0);
        sVar35 = pavgw(auVar83._10_2_ >> 6,0);
        sVar36 = pavgw(auVar83._12_2_ >> 6,0);
        sVar37 = pavgw(auVar83._14_2_ >> 6,0);
        auVar73._8_6_ = 0;
        auVar73._0_8_ = uVar6;
        auVar73[0xe] = (char)(uVar6 >> 0x38);
        auVar73[0xf] = (char)((ulong)lVar2 >> 0x38);
        auVar72._14_2_ = auVar73._14_2_;
        auVar72._8_5_ = 0;
        auVar72._0_8_ = uVar6;
        auVar72[0xd] = (char)((ulong)lVar2 >> 0x30);
        auVar71._13_3_ = auVar72._13_3_;
        auVar71._8_4_ = 0;
        auVar71._0_8_ = uVar6;
        auVar71[0xc] = (char)(uVar6 >> 0x30);
        auVar70._12_4_ = auVar71._12_4_;
        auVar70._8_3_ = 0;
        auVar70._0_8_ = uVar6;
        auVar70[0xb] = (char)((ulong)lVar2 >> 0x28);
        auVar69._11_5_ = auVar70._11_5_;
        auVar69._8_2_ = 0;
        auVar69._0_8_ = uVar6;
        auVar69[10] = (char)(uVar6 >> 0x28);
        auVar68._10_6_ = auVar69._10_6_;
        auVar68[8] = 0;
        auVar68._0_8_ = uVar6;
        auVar68[9] = (char)((ulong)lVar2 >> 0x20);
        auVar67._9_7_ = auVar68._9_7_;
        auVar67[8] = (char)(uVar6 >> 0x20);
        auVar67._0_8_ = uVar6;
        auVar66._8_8_ = auVar67._8_8_;
        uVar19 = (undefined1)((ulong)lVar2 >> 0x18);
        auVar66[7] = uVar19;
        uVar16 = (undefined1)(uVar6 >> 0x18);
        auVar66[6] = uVar16;
        uVar18 = (undefined1)((ulong)lVar2 >> 0x10);
        auVar66[5] = uVar18;
        uVar15 = (undefined1)(uVar6 >> 0x10);
        auVar66[4] = uVar15;
        uVar17 = (undefined1)((ulong)lVar2 >> 8);
        auVar66[3] = uVar17;
        uVar13 = (undefined1)(uVar6 >> 8);
        auVar66[2] = uVar13;
        auVar66[0] = (undefined1)uVar6;
        auVar66[1] = (char)lVar2;
        auVar83 = pshufb(auVar66,ZEXT816(0x907050308060402));
        auVar93._0_14_ = auVar84._0_14_;
        auVar93[0xe] = uVar19;
        auVar93[0xf] = auVar83[7];
        auVar92._14_2_ = auVar93._14_2_;
        auVar92._0_13_ = auVar84._0_13_;
        auVar92[0xd] = auVar83[6];
        auVar91._13_3_ = auVar92._13_3_;
        auVar91._0_12_ = auVar84._0_12_;
        auVar91[0xc] = uVar18;
        auVar90._12_4_ = auVar91._12_4_;
        auVar90._0_11_ = auVar84._0_11_;
        auVar90[0xb] = auVar83[5];
        auVar89._11_5_ = auVar90._11_5_;
        auVar89._0_10_ = auVar84._0_10_;
        auVar89[10] = uVar17;
        auVar88._10_6_ = auVar89._10_6_;
        auVar88._0_9_ = auVar84._0_9_;
        auVar88[9] = auVar83[4];
        auVar87._9_7_ = auVar88._9_7_;
        auVar87[8] = (char)lVar2;
        auVar86._8_8_ = auVar87._8_8_;
        auVar86[7] = auVar83[3];
        auVar86[6] = uVar16;
        auVar86[5] = auVar83[2];
        auVar86[4] = uVar15;
        auVar86[3] = auVar83[1];
        auVar86[2] = uVar13;
        auVar86[1] = auVar83[0];
        auVar86[0] = auVar66[0];
        auVar83 = pmaddubsw(auVar86,auVar11);
        sVar47 = pavgw(auVar83._0_2_ >> 6,0);
        sVar59 = pavgw(auVar83._2_2_ >> 6,0);
        sVar60 = pavgw(auVar83._4_2_ >> 6,0);
        sVar61 = pavgw(auVar83._6_2_ >> 6,0);
        sVar62 = pavgw(auVar83._8_2_ >> 6,0);
        sVar63 = pavgw(auVar83._10_2_ >> 6,0);
        sVar64 = pavgw(auVar83._12_2_ >> 6,0);
        sVar65 = pavgw(auVar83._14_2_ >> 6,0);
        *puVar7 = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
        puVar7[1] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar7[2] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar7[3] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar7[4] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar7[5] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar7[6] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar7[7] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar7[8] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar7[9] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
        puVar7[10] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
        puVar7[0xb] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
        puVar7[0xc] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
        puVar7[0xd] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        puVar7[0xe] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        puVar7[0xf] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        src = (uint8_t *)((long)src + (long)(src_stride << 2));
        puVar7 = puVar7 + 0x10;
        iVar10 = iVar10 + 4;
      } while (iVar10 < h);
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)src;
    auVar83 = pshufb(auVar14,_DAT_0050db60);
    auVar11 = pmaddubsw(auVar83,auVar11);
    sVar20 = pavgw(0,auVar11._0_2_ >> 6);
    sVar31 = pavgw(0,auVar11._2_2_ >> 6);
    sVar32 = pavgw(0,auVar11._4_2_ >> 6);
    sVar33 = pavgw(0,auVar11._6_2_ >> 6);
    pavgw(0,auVar11._8_2_ >> 6);
    pavgw(0,auVar11._10_2_ >> 6);
    pavgw(0,auVar11._12_2_ >> 6);
    pavgw(0,auVar11._14_2_ >> 6);
    *(uint *)puVar7 =
         CONCAT13((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                  CONCAT12((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32),
                           CONCAT11((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31)
                                    ,(0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 -
                                     (0xff < sVar20))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar9 = 0;
        uVar46 = *(undefined4 *)dst;
        do {
          uVar4 = *(undefined4 *)(dst + lVar9 * 4 + 4);
          uVar5 = *(undefined4 *)(dst + lVar9 * 4 + 4);
          uVar13 = pavgb((char)uVar5,(char)uVar46);
          uVar15 = pavgb((char)((uint)uVar5 >> 8),(char)((uint)uVar46 >> 8));
          uVar16 = pavgb((char)((uint)uVar5 >> 0x10),(char)((uint)uVar46 >> 0x10));
          uVar17 = pavgb((char)((uint)uVar5 >> 0x18),(char)((uint)uVar46 >> 0x18));
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          *(uint *)(dst + lVar9 * 4) = CONCAT13(uVar17,CONCAT12(uVar16,CONCAT11(uVar15,uVar13)));
          lVar9 = lVar9 + 1;
          uVar46 = uVar4;
        } while (h != (int)lVar9);
      }
    }
    else if (0 < h) {
      auVar11 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                        ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar12._0_4_ = auVar11._0_4_;
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = auVar12._0_4_;
      auVar12._12_4_ = auVar12._0_4_;
      uVar8 = (ulong)*(uint *)dst;
      lVar9 = 0;
      do {
        lVar3 = *(long *)(dst + lVar9 * 4 + 4);
        uVar46 = (undefined4)((ulong)lVar3 >> 0x20);
        auVar49._4_4_ = uVar46;
        auVar49._0_4_ = uVar46;
        uVar6 = *(ulong *)(dst + lVar9 * 4 + 0xc);
        auVar22._0_12_ = ZEXT812(0);
        auVar22._12_4_ = uVar46;
        auVar24._0_8_ = lVar3 << 0x20;
        auVar21._4_8_ = auVar22._8_8_;
        auVar21._0_4_ = (int)lVar3;
        auVar21._12_4_ = 0;
        auVar21 = auVar21 << 0x20;
        auVar49._8_4_ = uVar46;
        auVar49._12_4_ = (int)(uVar6 >> 0x20);
        auVar48._8_8_ = auVar49._8_8_;
        auVar48._0_8_ = CONCAT44((int)uVar6,uVar46);
        uVar19 = (undefined1)((ulong)lVar3 >> 0x38);
        auVar23[7] = (undefined1)((ulong)lVar3 >> 0x18);
        auVar30._0_14_ = auVar21._0_14_;
        auVar30[0xe] = auVar23[7];
        auVar30[0xf] = uVar19;
        auVar29._14_2_ = auVar30._14_2_;
        auVar29._0_13_ = auVar21._0_13_;
        uVar18 = (undefined1)((ulong)lVar3 >> 0x30);
        auVar29[0xd] = uVar18;
        uVar15 = (undefined1)((ulong)lVar3 >> 0x10);
        auVar28._13_3_ = auVar29._13_3_;
        auVar28._0_12_ = auVar21._0_12_;
        auVar28[0xc] = uVar15;
        auVar27._12_4_ = auVar28._12_4_;
        auVar27._0_11_ = auVar21._0_11_;
        uVar17 = (undefined1)((ulong)lVar3 >> 0x28);
        auVar27[0xb] = uVar17;
        uVar13 = (undefined1)((ulong)lVar3 >> 8);
        auVar26._11_5_ = auVar27._11_5_;
        auVar26._0_10_ = auVar21._0_10_;
        auVar26[10] = uVar13;
        auVar25._10_6_ = auVar26._10_6_;
        auVar25._0_9_ = auVar21._0_9_;
        uVar16 = (undefined1)((ulong)lVar3 >> 0x20);
        auVar25[9] = uVar16;
        auVar24._9_7_ = auVar25._9_7_;
        auVar24[8] = (char)lVar3;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23[6] = (char)(uVar8 >> 0x18);
        auVar23[5] = uVar15;
        auVar23[4] = (char)(uVar8 >> 0x10);
        auVar23[3] = uVar13;
        auVar23[2] = (char)(uVar8 >> 8);
        auVar23[0] = (undefined1)uVar8;
        auVar23[1] = (char)lVar3;
        auVar11 = pmaddubsw(auVar23,auVar12);
        sVar20 = pavgw(auVar11._0_2_ >> 6,0);
        sVar31 = pavgw(auVar11._2_2_ >> 6,0);
        sVar32 = pavgw(auVar11._4_2_ >> 6,0);
        sVar33 = pavgw(auVar11._6_2_ >> 6,0);
        sVar34 = pavgw(auVar11._8_2_ >> 6,0);
        sVar35 = pavgw(auVar11._10_2_ >> 6,0);
        sVar36 = pavgw(auVar11._12_2_ >> 6,0);
        sVar37 = pavgw(auVar11._14_2_ >> 6,0);
        auVar51[7] = (undefined1)(uVar6 >> 0x18);
        auVar58._0_14_ = auVar48._0_14_;
        auVar58[0xe] = auVar51[7];
        auVar58[0xf] = (char)(uVar6 >> 0x38);
        auVar57._14_2_ = auVar58._14_2_;
        auVar57._0_13_ = auVar48._0_13_;
        auVar57[0xd] = (char)(uVar6 >> 0x30);
        uVar15 = (undefined1)(uVar6 >> 0x10);
        auVar56._13_3_ = auVar57._13_3_;
        auVar56._0_12_ = auVar48._0_12_;
        auVar56[0xc] = uVar15;
        auVar55._12_4_ = auVar56._12_4_;
        auVar55._0_11_ = auVar48._0_11_;
        auVar55[0xb] = (char)(uVar6 >> 0x28);
        uVar13 = (undefined1)(uVar6 >> 8);
        auVar54._11_5_ = auVar55._11_5_;
        auVar54._0_10_ = auVar48._0_10_;
        auVar54[10] = uVar13;
        auVar53._10_6_ = auVar54._10_6_;
        auVar53._0_9_ = auVar48._0_9_;
        auVar53[9] = (char)(uVar6 >> 0x20);
        auVar52._9_7_ = auVar53._9_7_;
        auVar52[8] = (char)uVar6;
        auVar52._0_8_ = auVar48._0_8_;
        auVar51._8_8_ = auVar52._8_8_;
        auVar51[6] = uVar19;
        auVar51[5] = uVar15;
        auVar51[4] = uVar18;
        auVar51._0_4_ = uVar46;
        auVar50._4_12_ = auVar51._4_12_;
        auVar50[3] = uVar13;
        auVar50[2] = uVar17;
        auVar50[1] = (char)uVar6;
        auVar50[0] = uVar16;
        auVar11 = pmaddubsw(auVar50,auVar12);
        sVar47 = pavgw(auVar11._0_2_ >> 6,0);
        sVar59 = pavgw(auVar11._2_2_ >> 6,0);
        sVar60 = pavgw(auVar11._4_2_ >> 6,0);
        sVar61 = pavgw(auVar11._6_2_ >> 6,0);
        sVar62 = pavgw(auVar11._8_2_ >> 6,0);
        sVar63 = pavgw(auVar11._10_2_ >> 6,0);
        sVar64 = pavgw(auVar11._12_2_ >> 6,0);
        sVar65 = pavgw(auVar11._14_2_ >> 6,0);
        puVar7 = dst + lVar9 * 4;
        *puVar7 = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
        puVar7[1] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar7[2] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar7[3] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar7[4] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar7[5] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar7[6] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar7[7] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar7[8] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar7[9] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
        puVar7[10] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
        puVar7[0xb] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
        puVar7[0xc] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
        puVar7[0xd] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        puVar7[0xe] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        puVar7[0xf] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        uVar8 = uVar6 >> 0x20;
        lVar9 = lVar9 + 4;
      } while ((int)lVar9 < h);
    }
  }
  return;
}

Assistant:

static void bilinear_filter4xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = xx_loadl_32((__m128i *)src);
      xx_storel_32(b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      xx_storel_32(b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i x0 = _mm_loadl_epi64((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadl_epi64((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i x2 = _mm_loadl_epi64((__m128i *)&src[src_stride * 2]);
      const __m128i z2 = _mm_srli_si128(x2, 1);
      const __m128i x3 = _mm_loadl_epi64((__m128i *)&src[src_stride * 3]);
      const __m128i z3 = _mm_srli_si128(x3, 1);

      const __m128i a0 = _mm_unpacklo_epi32(x0, x1);
      const __m128i b0 = _mm_unpacklo_epi32(z0, z1);
      const __m128i a1 = _mm_unpacklo_epi32(x2, x3);
      const __m128i b1 = _mm_unpacklo_epi32(z2, z3);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 4;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x = _mm_loadl_epi64((__m128i *)src);
    const __m128i z = _mm_srli_si128(x, 1);

    __m128i v0 = _mm_unpacklo_epi8(x, z);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    xx_storel_32(b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = xx_loadl_32((__m128i *)dst);
      __m128i y = xx_loadl_32((__m128i *)&dst[4]);
      xx_storel_32(dst, _mm_avg_epu8(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i a = xx_loadl_32((__m128i *)dst);
      const __m128i b = xx_loadl_32((__m128i *)&dst[4]);
      const __m128i c = xx_loadl_32((__m128i *)&dst[8]);
      const __m128i d = xx_loadl_32((__m128i *)&dst[12]);
      const __m128i e = xx_loadl_32((__m128i *)&dst[16]);

      const __m128i a0 = _mm_unpacklo_epi32(a, b);
      const __m128i b0 = _mm_unpacklo_epi32(b, c);
      const __m128i a1 = _mm_unpacklo_epi32(c, d);
      const __m128i b1 = _mm_unpacklo_epi32(d, e);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}